

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O1

void __thiscall Fl_Group::clear(Fl_Group *this)

{
  uint uVar1;
  Fl_Widget **ppFVar2;
  Fl_Widget *pFVar3;
  int iVar4;
  Fl_Widget ***pppFVar5;
  Fl_Widget **ppFVar6;
  ulong uVar7;
  Fl_Group *o;
  
  this->savedfocus_ = (Fl_Widget *)0x0;
  this->resizable_ = &this->super_Fl_Widget;
  if (this->sizes_ != (int *)0x0) {
    operator_delete__(this->sizes_);
  }
  this->sizes_ = (int *)0x0;
  o = (Fl_Group *)Fl::pushed_;
  iVar4 = Fl_Widget::contains(&this->super_Fl_Widget,Fl::pushed_);
  if (iVar4 != 0) {
    o = this;
  }
  Fl::pushed(&this->super_Fl_Widget);
  uVar1 = this->children_;
  if (1 < (long)(int)uVar1) {
    ppFVar2 = this->array_;
    ppFVar6 = ppFVar2 + (int)uVar1;
    uVar7 = 0;
    do {
      ppFVar6 = ppFVar6 + -1;
      pFVar3 = ppFVar2[uVar7];
      ppFVar2[uVar7] = *ppFVar6;
      *ppFVar6 = pFVar3;
      uVar7 = uVar7 + 1;
    } while (uVar1 >> 1 != uVar7);
  }
  iVar4 = this->children_;
  if (iVar4 != 0) {
    do {
      pppFVar5 = &this->array_;
      if (1 < iVar4) {
        pppFVar5 = (Fl_Widget ***)this->array_;
      }
      uVar1 = iVar4 - 1;
      ppFVar6 = pppFVar5[(long)iVar4 + -1];
      if ((Fl_Group *)ppFVar6[1] == this) {
        if (iVar4 < 3) {
          remove(this,(char *)(ulong)uVar1);
        }
        else {
          ppFVar6[1] = (Fl_Widget *)0x0;
          this->children_ = uVar1;
        }
        (*(code *)(*ppFVar6)->parent_)(ppFVar6);
      }
      else {
        remove(this,(char *)(ulong)uVar1);
      }
      iVar4 = this->children_;
    } while (iVar4 != 0);
  }
  if (o != this) {
    Fl::pushed(&o->super_Fl_Widget);
    return;
  }
  return;
}

Assistant:

void Fl_Group::clear() {
  savedfocus_ = 0;
  resizable_ = this;
  init_sizes();

  // we must change the Fl::pushed() widget, if it is one of
  // the group's children. Otherwise fl_fix_focus() would send
  // lots of events to children that are about to be deleted
  // anyway.

  Fl_Widget *pushed = Fl::pushed();	// save pushed() widget
  if (contains(pushed)) pushed = this;	// set it to be the group, if it's a child
  Fl::pushed(this);			// for fl_fix_focus etc.

  // okay, now it is safe to destroy the children:

#define REVERSE_CHILDREN
#ifdef  REVERSE_CHILDREN
  // Reverse the order of the children. Doing this and deleting
  // always the last child is much faster than the other way around.
  if (children_ > 1) {
    Fl_Widget *temp;
    Fl_Widget **a = (Fl_Widget**)array();
    for (int i=0,j=children_-1; i<children_/2; i++,j--) {
      temp = a[i];
      a[i] = a[j];
      a[j] = temp;
    }
  }
#endif // REVERSE_CHILDREN

  while (children_) {			// delete all children
    int idx = children_-1;		// last child's index
    Fl_Widget* w = child(idx);		// last child widget
    if (w->parent()==this) {		// should always be true
      if (children_>2) {		// optimized removal
        w->parent_ = 0;			// reset child's parent
        children_--;			// update counter
      } else {				// slow removal
        remove(idx);
      }
      delete w;				// delete the child
    } else {				// should never happen
      remove(idx);			// remove it anyway
    }
  }

  if (pushed != this) Fl::pushed(pushed); // reset pushed() widget

}